

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int archive_read_format_7zip_bid(archive_read *a,int best_bid)

{
  int iVar1;
  void *pvVar2;
  int step;
  char *buff;
  ssize_t bytes_avail;
  ssize_t window;
  ssize_t offset;
  char *p;
  archive_read *paStack_18;
  int best_bid_local;
  archive_read *a_local;
  
  if (best_bid < 0x21) {
    p._4_4_ = best_bid;
    paStack_18 = a;
    offset = (ssize_t)__archive_read_ahead(a,6,(ssize_t *)0x0);
    if ((void *)offset == (void *)0x0) {
      a_local._4_4_ = 0;
    }
    else {
      iVar1 = memcmp((void *)offset,anon_var_dwarf_ed184,6);
      if (iVar1 == 0) {
        a_local._4_4_ = 0x30;
      }
      else if (((*(char *)offset == 'M') && (*(char *)(offset + 1) == 'Z')) ||
              (*(int *)offset == 0x464c457f)) {
        window = 0x27000;
        bytes_avail = 0x1000;
        do {
          while( true ) {
            if (0x60000 < window + bytes_avail) goto LAB_002065a8;
            pvVar2 = __archive_read_ahead(paStack_18,window + bytes_avail,(ssize_t *)&buff);
            if (pvVar2 == (void *)0x0) break;
            for (offset = (long)pvVar2 + window;
                (char *)(offset + 0x20U) < (char *)((long)pvVar2 + (long)buff);
                offset = offset + iVar1) {
              iVar1 = check_7zip_header_in_sfx((char *)offset);
              if (iVar1 == 0) {
                return 0x30;
              }
            }
            window = offset - (long)pvVar2;
          }
          bytes_avail = bytes_avail >> 1;
        } while (0x3f < bytes_avail);
        a_local._4_4_ = 0;
      }
      else {
LAB_002065a8:
        a_local._4_4_ = 0;
      }
    }
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_7zip_bid(struct archive_read *a, int best_bid)
{
	const char *p;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	if ((p = __archive_read_ahead(a, 6, NULL)) == NULL)
		return (0);

	/* If first six bytes are the 7-Zip signature,
	 * return the bid right now. */
	if (memcmp(p, _7ZIP_SIGNATURE, 6) == 0)
		return (48);

	/*
	 * It may a 7-Zip SFX archive file. If first two bytes are
	 * 'M' and 'Z' available on Windows or first four bytes are
	 * "\x7F\x45LF" available on posix like system, seek the 7-Zip
	 * signature. Although we will perform a seek when reading
	 * a header, what we do not use __archive_read_seek() here is
	 * due to a bidding performance.
	 */
	if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
		ssize_t offset = SFX_MIN_ADDR;
		ssize_t window = 4096;
		ssize_t bytes_avail;
		while (offset + window <= (SFX_MAX_ADDR)) {
			const char *buff = __archive_read_ahead(a,
					offset + window, &bytes_avail);
			if (buff == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < 0x40)
					return (0);
				continue;
			}
			p = buff + offset;
			while (p + 32 < buff + bytes_avail) {
				int step = check_7zip_header_in_sfx(p);
				if (step == 0)
					return (48);
				p += step;
			}
			offset = p - buff;
		}
	}
	return (0);
}